

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall AggressiveBotStrategy::fortifyToCountryIndex(AggressiveBotStrategy *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer ppCVar3;
  Country *pCVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
  ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    uVar7 = 0;
    iVar8 = 2;
    uVar5 = 0;
    do {
      pCVar4 = ppCVar3[uVar7];
      iVar1 = *pCVar4->pNumberOfTroops;
      if (iVar8 <= iVar1) {
        (this->super_PlayerStrategy).to = pCVar4;
        uVar5 = uVar7 & 0xffffffff;
        iVar8 = iVar1;
      }
      uVar7 = uVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != uVar7);
    return (int)uVar5;
  }
  return 0;
}

Assistant:

int AggressiveBotStrategy::fortifyToCountryIndex() {
    int toCountry = 0;
    int numTroops = 2;
    for (int i = 0; i < from->getAdjCountries()->size(); i++) {
        if (from->getAdjCountries()->at(i)->getNumberOfTroops() >= numTroops) {
            toCountry = i;
            numTroops = from->getAdjCountries()->at(i)->getNumberOfTroops();
            to = from->getAdjCountries()->at(i);
        }
    }
    return toCountry;
}